

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O2

mz_bool duckdb_miniz::mz_zip_end(mz_zip_archive *pZip)

{
  mz_bool mVar1;
  
  if (pZip != (mz_zip_archive *)0x0) {
    if (pZip->m_zip_mode - MZ_ZIP_MODE_WRITING < 2) {
      mVar1 = mz_zip_writer_end(pZip);
      return mVar1;
    }
    if (pZip->m_zip_mode == MZ_ZIP_MODE_READING) {
      mVar1 = mz_zip_reader_end(pZip);
      return mVar1;
    }
  }
  return 0;
}

Assistant:

mz_bool mz_zip_end(mz_zip_archive *pZip)
{
    if (!pZip)
        return MZ_FALSE;

    if (pZip->m_zip_mode == MZ_ZIP_MODE_READING)
        return mz_zip_reader_end(pZip);
#ifndef MINIZ_NO_ARCHIVE_WRITING_APIS
    else if ((pZip->m_zip_mode == MZ_ZIP_MODE_WRITING) || (pZip->m_zip_mode == MZ_ZIP_MODE_WRITING_HAS_BEEN_FINALIZED))
        return mz_zip_writer_end(pZip);
#endif

    return MZ_FALSE;
}